

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_csv.cpp
# Opt level: O1

void duckdb::WriteQuotedString
               (WriteStream *writer,WriteCSVData *csv_data,char *str,idx_t len,bool force_quote)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this;
  char cVar1;
  char escape;
  int iVar2;
  reference pvVar3;
  idx_t iVar4;
  undefined3 in_register_00000081;
  uint uVar5;
  string new_val;
  string local_70;
  string local_50;
  
  uVar5 = CONCAT31(in_register_00000081,force_quote);
  if (uVar5 == 0) {
    this = &(csv_data->super_BaseCSVData).options.null_str;
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this,0);
    if (pvVar3->_M_string_length != len) {
LAB_00a7e0c3:
      uVar5 = (uint)(len != 0);
      if (len != 0) {
        iVar4 = 0;
        do {
          if ((csv_data->requires_quotes).super_unique_ptr<bool[],_std::default_delete<bool[]>_>.
              _M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
              super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
              super__Head_base<0UL,_bool_*,_false>._M_head_impl[(byte)str[iVar4]] != false)
          goto LAB_00a7e0ef;
          iVar4 = iVar4 + 1;
        } while (len != iVar4);
        goto LAB_00a7e15f;
      }
      goto LAB_00a7e0ea;
    }
    pvVar3 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](this,0);
    iVar2 = bcmp(str,(pvVar3->_M_dataplus)._M_p,len);
    if (iVar2 != 0) goto LAB_00a7e0c3;
  }
  else {
LAB_00a7e0ea:
    if ((char)uVar5 == '\0') goto LAB_00a7e15f;
  }
LAB_00a7e0ef:
  cVar1 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.value;
  if (cVar1 != '\0') {
    if (len != 0) {
      iVar4 = 0;
      do {
        if ((str[iVar4] == cVar1) ||
           (str[iVar4] ==
            (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.escape.value
           )) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,str,str + len);
          cVar1 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.escape
                  .value;
          AddEscapes(&local_50,cVar1,cVar1,&local_70);
          ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
              &local_50.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p
                                    ));
          }
          cVar1 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.
                  value;
          escape = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.
                   escape.value;
          if (escape != cVar1) {
            AddEscapes(&local_50,cVar1,escape,&local_70);
            ::std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_50._M_dataplus._M_p._1_7_,(char)local_50._M_dataplus._M_p) !=
                &local_50.field_2) {
              operator_delete((undefined1 *)
                              CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                       (char)local_50._M_dataplus._M_p));
            }
          }
          cVar1 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.
                  value;
          if (cVar1 != '\0') {
            local_50._M_dataplus._M_p._0_1_ = cVar1;
            (**writer->_vptr_WriteStream)(writer,&local_50,1);
          }
          (**writer->_vptr_WriteStream)(writer,local_70._M_dataplus._M_p,local_70._M_string_length);
          cVar1 = (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.
                  value;
          if (cVar1 != '\0') {
            local_50._M_dataplus._M_p._0_1_ = cVar1;
            (**writer->_vptr_WriteStream)(writer,&local_50,1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p == &local_70.field_2) {
            return;
          }
          operator_delete(local_70._M_dataplus._M_p);
          return;
        }
        iVar4 = iVar4 + 1;
      } while (len != iVar4);
    }
    local_70._M_dataplus._M_p._0_1_ = cVar1;
    (**writer->_vptr_WriteStream)(writer,&local_70,1);
    (**writer->_vptr_WriteStream)(writer,str,len);
    local_70._M_dataplus._M_p._0_1_ =
         (csv_data->super_BaseCSVData).options.dialect_options.state_machine_options.quote.value;
    if ((char)local_70._M_dataplus._M_p != '\0') {
      (**writer->_vptr_WriteStream)(writer,&local_70,1);
    }
    return;
  }
LAB_00a7e15f:
  (**writer->_vptr_WriteStream)(writer,str,len);
  return;
}

Assistant:

static void WriteQuotedString(WriteStream &writer, WriteCSVData &csv_data, const char *str, idx_t len,
                              bool force_quote) {
	auto &options = csv_data.options;
	if (!force_quote) {
		// force quote is disabled: check if we need to add quotes anyway
		force_quote = RequiresQuotes(csv_data, str, len);
	}
	// If a quote is set to none (i.e., null-terminator) we skip the quotation
	if (force_quote && options.dialect_options.state_machine_options.quote.GetValue() != '\0') {
		// quoting is enabled: we might need to escape things in the string
		bool requires_escape = false;
		// simple CSV
		// do a single loop to check for a quote or escape value
		for (idx_t i = 0; i < len; i++) {
			if (str[i] == options.dialect_options.state_machine_options.quote.GetValue() ||
			    str[i] == options.dialect_options.state_machine_options.escape.GetValue()) {
				requires_escape = true;
				break;
			}
		}

		if (!requires_escape) {
			// fast path: no need to escape anything
			WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
			writer.WriteData(const_data_ptr_cast(str), len);
			WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
			return;
		}

		// slow path: need to add escapes
		string new_val(str, len);
		new_val = AddEscapes(options.dialect_options.state_machine_options.escape.GetValue(),
		                     options.dialect_options.state_machine_options.escape.GetValue(), new_val);
		if (options.dialect_options.state_machine_options.escape !=
		    options.dialect_options.state_machine_options.quote) {
			// need to escape quotes separately
			new_val = AddEscapes(options.dialect_options.state_machine_options.quote.GetValue(),
			                     options.dialect_options.state_machine_options.escape.GetValue(), new_val);
		}
		WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
		writer.WriteData(const_data_ptr_cast(new_val.c_str()), new_val.size());
		WriteQuoteOrEscape(writer, options.dialect_options.state_machine_options.quote.GetValue());
	} else {
		writer.WriteData(const_data_ptr_cast(str), len);
	}
}